

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O2

int substricmp(char *nptr,char *subsrt)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  lVar4 = 0;
  for (iVar3 = 0; (bVar1 = subsrt[lVar4], bVar1 != 0 && (iVar3 == 0)); iVar3 = iVar3 - iVar5) {
    cVar2 = nptr[lVar4];
    iVar3 = cVar2 + -0x20;
    if (0x19 < (byte)(cVar2 + 0x9fU)) {
      iVar3 = (int)cVar2;
    }
    iVar5 = bVar1 - 0x20;
    if (0x19 < (byte)(bVar1 + 0x9f)) {
      iVar5 = (int)(char)bVar1;
    }
    lVar4 = lVar4 + 1;
  }
  return iVar3;
}

Assistant:

static int substricmp(const char* nptr, const char* subsrt)
{
    int result = 0;
    while (((*subsrt) != '\0') && (result == 0))
    {
        result = TOUPPER(*nptr) - TOUPPER(*subsrt);
        nptr++;
        subsrt++;
    }
    return result;
}